

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_valid.c
# Opt level: O0

longlong amd_l_valid(longlong n_row,longlong n_col,longlong *Ap,longlong *Ai)

{
  long lVar1;
  longlong result;
  longlong p;
  longlong i;
  longlong ilast;
  longlong p2;
  longlong p1;
  longlong j;
  longlong nz;
  longlong *Ai_local;
  longlong *Ap_local;
  longlong n_col_local;
  longlong n_row_local;
  longlong local_8;
  
  result = 0;
  if ((((n_row < 0) || (n_col < 0)) || (Ap == (longlong *)0x0)) || (Ai == (longlong *)0x0)) {
    local_8 = -2;
  }
  else if ((*Ap == 0) && (-1 < Ap[n_col])) {
    for (j = 0; j < n_col; j = j + 1) {
      p = Ap[j];
      if (Ap[j + 1] < p) {
        return -2;
      }
      ilast = -1;
      for (; p < Ap[j + 1]; p = p + 1) {
        lVar1 = Ai[p];
        if ((lVar1 < 0) || (n_row <= lVar1)) {
          return -2;
        }
        if (lVar1 <= ilast) {
          result = 1;
        }
        ilast = lVar1;
      }
    }
    local_8 = result;
  }
  else {
    local_8 = -2;
  }
  return local_8;
}

Assistant:

GLOBAL Int AMD_valid
(
    /* inputs, not modified on output: */
    Int n_row,		/* A is n_row-by-n_col */
    Int n_col,
    const Int Ap [ ],	/* column pointers of A, of size n_col+1 */
    const Int Ai [ ]	/* row indices of A, of size nz = Ap [n_col] */
)
{
    Int nz, j, p1, p2, ilast, i, p, result = AMD_OK ;

    if (n_row < 0 || n_col < 0 || Ap == NULL || Ai == NULL)
    {
	return (AMD_INVALID) ;
    }
    nz = Ap [n_col] ;
    if (Ap [0] != 0 || nz < 0)
    {
	/* column pointers must start at Ap [0] = 0, and Ap [n] must be >= 0 */
	AMD_DEBUG0 (("column 0 pointer bad or nz < 0\n")) ;
	return (AMD_INVALID) ;
    }
    for (j = 0 ; j < n_col ; j++)
    {
	p1 = Ap [j] ;
	p2 = Ap [j+1] ;
	AMD_DEBUG2 (("\nColumn: "ID" p1: "ID" p2: "ID"\n", j, p1, p2)) ;
	if (p1 > p2)
	{
	    /* column pointers must be ascending */
	    AMD_DEBUG0 (("column "ID" pointer bad\n", j)) ;
	    return (AMD_INVALID) ;
	}
	ilast = EMPTY ;
	for (p = p1 ; p < p2 ; p++)
	{
	    i = Ai [p] ;
	    AMD_DEBUG3 (("row: "ID"\n", i)) ;
	    if (i < 0 || i >= n_row)
	    {
		/* row index out of range */
		AMD_DEBUG0 (("index out of range, col "ID" row "ID"\n", j, i));
		return (AMD_INVALID) ;
	    }
	    if (i <= ilast)
	    {
		/* row index unsorted, or duplicate entry present */
		AMD_DEBUG1 (("index unsorted/dupl col "ID" row "ID"\n", j, i));
		result = AMD_OK_BUT_JUMBLED ;
	    }
	    ilast = i ;
	}
    }
    return (result) ;
}